

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.h
# Opt level: O2

void ehooks_pre_reentrancy(tsdn_t *tsdn)

{
  if (tsdn == (tsdn_t *)0x0) {
    tsdn = (tsdn_t *)__tls_get_addr(&PTR_027f6ac0);
    if ((((tsd_t *)tsdn)->state).repr != '\0') {
      tsdn = (tsdn_t *)duckdb_je_tsd_fetch_slow((tsd_t *)tsdn,false);
    }
  }
  (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
       (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
  if ((tsdn->tsd).state.repr != '\0') {
    return;
  }
  duckdb_je_tsd_slow_update(&tsdn->tsd);
  return;
}

Assistant:

static inline void
ehooks_pre_reentrancy(tsdn_t *tsdn) {
	tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
	tsd_pre_reentrancy_raw(tsd);
}